

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O1

BitTrie * __thiscall
slang::PoolAllocator<slang::ast::BitTrie,_72UL,_8UL>::emplace<slang::ast::BitTrie>
          (PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *this)

{
  BumpAllocator *this_00;
  FreeNode *result;
  BitTrie *pBVar1;
  
  pBVar1 = (BitTrie *)this->freeList;
  if (pBVar1 == (BitTrie *)0x0) {
    this_00 = this->alloc;
    pBVar1 = (BitTrie *)((ulong)(this_00->head->current + 7) & 0xfffffffffffffff8);
    if ((BitTrie *)this_00->endPtr < pBVar1 + 1) {
      pBVar1 = (BitTrie *)BumpAllocator::allocateSlow(this_00,0x48,8);
    }
    else {
      this_00->head->current = (byte *)(pBVar1 + 1);
    }
  }
  else {
    this->freeList = (FreeNode *)pBVar1->children[0];
  }
  pBVar1->children[6] = (BitTrie *)0x0;
  pBVar1->children[7] = (BitTrie *)0x0;
  pBVar1->children[4] = (BitTrie *)0x0;
  pBVar1->children[5] = (BitTrie *)0x0;
  pBVar1->children[2] = (BitTrie *)0x0;
  pBVar1->children[3] = (BitTrie *)0x0;
  pBVar1->children[0] = (BitTrie *)0x0;
  pBVar1->children[1] = (BitTrie *)0x0;
  pBVar1->entry = (UdpEntrySyntax *)0x0;
  return pBVar1;
}

Assistant:

TSubClass* emplace(Args&&... args) {
        static_assert(sizeof(TSubClass) <= Size);
        static_assert(alignof(TSubClass) <= Align);
        static_assert(std::is_trivially_destructible_v<TSubClass>);
        auto mem = freeList ? reinterpret_cast<TSubClass*>(pop())
                            : reinterpret_cast<TSubClass*>(alloc.allocate(Size, Align));
        return new (mem) TSubClass(std::forward<Args>(args)...);
    }